

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameTypes.cpp
# Opt level: O2

void __thiscall wasm::NameTypes::run(NameTypes *this,Module *module)

{
  string *__return_storage_ptr__;
  IString *pIVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_00;
  HeapType *type;
  undefined1 auVar5 [8];
  unsigned_long __val;
  undefined1 local_e0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  used;
  char *pcStack_a0;
  undefined1 local_98 [8];
  string name;
  char *pcStack_70;
  undefined1 local_58 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_58,module);
  local_e0 = (undefined1  [8])&used._M_h._M_rehash_policy._M_next_resize;
  used._M_h._M_buckets = (__buckets_ptr)0x1;
  used._M_h._M_bucket_count = 0;
  used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  used._M_h._M_element_count._0_4_ = 0x3f800000;
  used._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  used._M_h._M_rehash_policy._4_4_ = 0;
  used._M_h._M_rehash_policy._M_next_resize = 0;
  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
       super__Vector_impl_data._M_start;
  this_00 = &module->typeNames;
  __val = 0;
  __return_storage_ptr__ = (string *)(name.field_2._M_local_buf + 8);
  auVar5 = local_58;
  do {
    if (auVar5 == (undefined1  [8])
                  types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      auVar5 = local_58;
      do {
        if (auVar5 == (undefined1  [8])
                      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
          std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_e0);
          std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                    ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_58);
          return;
        }
        pmVar3 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar5);
        IString::toString_abi_cxx11_((string *)local_98,(IString *)pmVar3);
        while ((pointer)0x1 < name._M_dataplus._M_p) {
          if (9 < (int)((pointer)((long)local_98 + -1))[(long)name._M_dataplus._M_p] - 0x30U) {
            if (((pointer)((long)local_98 + -1))[(long)name._M_dataplus._M_p] == '_') {
              std::__cxx11::string::pop_back();
              pIVar1 = (IString *)((long)&name.field_2 + 8);
              IString::IString(pIVar1,(string *)local_98);
              sVar4 = std::
                      _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_e0,(key_type *)pIVar1);
              if (sVar4 == 0) {
                IString::IString((IString *)((long)&name.field_2 + 8),(string *)local_98);
                (pmVar3->name).super_IString.str._M_len = name.field_2._8_8_;
                (pmVar3->name).super_IString.str._M_str = pcStack_70;
                pIVar1 = (IString *)((long)&name.field_2 + 8);
                IString::IString(pIVar1,(string *)local_98);
                std::__detail::
                _Insert<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                ::insert((_Insert<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                          *)local_e0,(value_type *)pIVar1);
              }
            }
            break;
          }
          std::__cxx11::string::pop_back();
        }
        std::__cxx11::string::~string((string *)local_98);
        auVar5 = (undefined1  [8])((long)auVar5 + 8);
      } while( true );
    }
    sVar2 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&this_00->_M_h,(key_type *)auVar5);
    if (sVar2 == 0) {
LAB_00ab4a0b:
      std::__cxx11::to_string(__return_storage_ptr__,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "type_",__return_storage_ptr__);
      IString::IString((IString *)&used._M_h._M_single_bucket,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                      );
      pmVar3 = std::__detail::
               _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)auVar5);
      __val = __val + 1;
      (pmVar3->name).super_IString.str._M_len = (size_t)used._M_h._M_single_bucket;
      (pmVar3->name).super_IString.str._M_str = pcStack_a0;
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    else {
      pmVar3 = std::__detail::
               _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)auVar5);
      if (0x13 < (pmVar3->name).super_IString.str._M_len) goto LAB_00ab4a0b;
    }
    pmVar3 = std::__detail::
             _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)auVar5);
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_e0,&pmVar3->name);
    auVar5 = (undefined1  [8])((long)auVar5 + 8);
  } while( true );
}

Assistant:

void run(Module* module) override {
    // Find all the types.
    std::vector<HeapType> types = ModuleUtils::collectHeapTypes(*module);

    std::unordered_set<Name> used;

    // Ensure simple names. If a name already exists, and is short enough, keep
    // it.
    size_t i = 0;
    for (auto& type : types) {
      if (module->typeNames.count(type) == 0 ||
          module->typeNames[type].name.size() >= NameLenLimit) {
        module->typeNames[type].name = "type_" + std::to_string(i++);
      }
      used.insert(module->typeNames[type].name);
    }

    // "Lint" the names a little. In particular a name with a "_7" or such
    // suffix, as TypeSSA creates, can be removed if it does not cause a
    // collision. This keeps the names unique while removing 'noise.'
    //
    // Note we must iterate in a deterministic order here, so do it on |types|.
    for (auto& type : types) {
      auto& names = module->typeNames[type];
      std::string name = names.name.toString();
      while (name.size() > 1 && isdigit(name.back())) {
        name.pop_back();
      }
      if (name.size() > 1 && name.back() == '_') {
        name.pop_back();
        if (!used.count(name)) {
          names.name = name;
          used.insert(name);
        }
      }
    }
  }